

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

optional<pbrt::CameraWiSample> * __thiscall
pbrt::PerspectiveCamera::SampleWi
          (optional<pbrt::CameraWiSample> *__return_storage_ptr__,PerspectiveCamera *this,
          Interaction *ref,Point2f *u,SampledWavelengths *lambda)

{
  Float *pFVar1;
  Interval<float> *pIVar2;
  long lVar3;
  undefined8 uVar4;
  uintptr_t uVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  undefined1 auVar8 [16];
  Interval<float> IVar9;
  Interval<float> IVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [12];
  ulong uVar16;
  SampledWavelengths *lambda_00;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [56];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  SampledSpectrum SVar37;
  Point3f PVar38;
  Vector3f VVar39;
  Point2f pRaster;
  SampledSpectrum Wi;
  undefined1 local_148 [16];
  Tuple2<pbrt::Point2,_float> local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  Tuple3<pbrt::Vector3,_float> local_e8;
  undefined1 local_d8 [16];
  Interval<float> IStack_c8;
  Float FStack_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  Tuple3<pbrt::Normal3,_float> TStack_b0;
  float fStack_a4;
  float fStack_a0;
  undefined4 uStack_9c;
  MediumInterface *local_98;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_90;
  RayDifferential local_88;
  undefined1 auVar31 [56];
  
  pFVar1 = &(this->super_ProjectiveCamera).lensRadius;
  local_148._0_4_ = *pFVar1;
  auVar15 = *(undefined1 (*) [12])pFVar1;
  fVar18 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  fVar21 = (u->super_Tuple2<pbrt::Point2,_float>).y;
  auVar19._0_4_ = fVar18 + fVar18;
  auVar19._4_4_ = fVar21 + fVar21;
  auVar19._8_8_ = 0;
  auVar27._8_4_ = 0xbf800000;
  auVar27._0_8_ = 0xbf800000bf800000;
  auVar27._12_4_ = 0xbf800000;
  auVar19 = vaddps_avx512vl(auVar19,auVar27);
  fVar21 = auVar19._0_4_;
  auVar27 = vmovshdup_avx(auVar19);
  fVar18 = auVar27._0_4_;
  if (fVar21 == 0.0) {
    auVar27 = ZEXT816(0) << 0x40;
    if ((fVar18 == 0.0) && (!NAN(fVar18))) goto LAB_0039088c;
  }
  auVar20._8_4_ = 0x7fffffff;
  auVar20._0_8_ = 0x7fffffff7fffffff;
  auVar20._12_4_ = 0x7fffffff;
  auVar20 = vandps_avx512vl(auVar19,auVar20);
  auVar36._0_4_ = fVar21 / fVar18;
  auVar36._4_12_ = auVar19._4_12_;
  auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar36,ZEXT416(0x3fc90fdb));
  auVar27 = vshufps_avx(auVar20,auVar20,0xf5);
  bVar7 = auVar27._0_4_ < auVar20._0_4_;
  fVar17 = (float)((uint)bVar7 * (int)((fVar18 / fVar21) * 0.7853982) + (uint)!bVar7 * auVar19._0_4_
                  );
  fVar18 = (float)((uint)bVar7 * (int)fVar21 + (uint)!bVar7 * (int)fVar18);
  fVar21 = cosf(fVar17);
  fVar17 = sinf(fVar17);
  local_148._0_4_ = auVar15._0_4_;
  auVar27 = vinsertps_avx(ZEXT416((uint)(fVar18 * fVar21)),ZEXT416((uint)(fVar18 * fVar17)),0x10);
LAB_0039088c:
  auVar22._0_4_ = (float)local_148._0_4_ * auVar27._0_4_;
  auVar22._4_4_ = (float)local_148._0_4_ * auVar27._4_4_;
  auVar22._8_4_ = (float)local_148._0_4_ * auVar27._8_4_;
  auVar22._12_4_ = (float)local_148._0_4_ * auVar27._12_4_;
  local_88.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar22);
  local_88.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_148._8_8_ = 0;
  PVar38 = AnimatedTransform::operator()((AnimatedTransform *)this,(Point3f *)&local_88,ref->time);
  fVar18 = PVar38.super_Tuple3<pbrt::Point3,_float>.z;
  local_88.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_88.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_88.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = 1.0;
  local_148._0_8_ = PVar38.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar26 = (undefined1  [56])0x0;
  VVar39 = AnimatedTransform::operator()((AnimatedTransform *)this,(Vector3f *)&local_88,ref->time);
  fVar17 = VVar39.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar24._0_8_ = VVar39.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar24._8_56_ = auVar26;
  FStack_c0 = ref->time;
  local_90.bits =
       (this->super_ProjectiveCamera).super_CameraBase.medium.
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
       .bits;
  auVar20 = auVar24._0_16_;
  auVar35._4_4_ = fVar18;
  auVar35._0_4_ = fVar18;
  auVar35._8_4_ = fVar18;
  auVar35._12_4_ = fVar18;
  local_d8 = vshufps_avx(local_148,local_148,0x50);
  IStack_c8 = (Interval<float>)vmovlps_avx(auVar35);
  fStack_bc = 0.0;
  fStack_b8 = 0.0;
  fStack_b4 = 0.0;
  TStack_b0._0_8_ = vmovlps_avx(auVar20);
  fStack_a4 = 0.0;
  fStack_a0 = 0.0;
  local_98 = (MediumInterface *)0x0;
  auVar6._0_4_ = (ref->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar6._4_4_ = (ref->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar6._8_4_ = (ref->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar6._12_4_ =
       (ref->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  uVar4 = *(undefined8 *)
           &(ref->pi).super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar27 = vinsertps_avx(auVar6,ZEXT416((uint)(ref->pi).super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                               high),0x10);
  fVar21 = (fVar18 + fVar18) * 0.5 -
           ((ref->pi).super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
           (ref->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  fVar18 = (float)((ulong)local_148._8_8_ >> 0x20);
  auVar28._0_4_ =
       (PVar38.super_Tuple3<pbrt::Point3,_float>.x + PVar38.super_Tuple3<pbrt::Point3,_float>.x) *
       0.5;
  auVar28._4_4_ =
       (PVar38.super_Tuple3<pbrt::Point3,_float>.y + PVar38.super_Tuple3<pbrt::Point3,_float>.y) *
       0.5;
  auVar28._8_4_ = ((float)local_148._8_8_ + (float)local_148._8_8_) * 0.5;
  auVar28._12_4_ = (fVar18 + fVar18) * 0.5;
  auVar32._0_4_ = ((float)uVar4 + auVar27._0_4_) * 0.5;
  auVar32._4_4_ = ((float)((ulong)uVar4 >> 0x20) + auVar27._4_4_) * 0.5;
  auVar32._8_4_ = (auVar27._8_4_ + 0.0) * 0.5;
  auVar32._12_4_ = (auVar27._12_4_ + 0.0) * 0.5;
  auVar19 = vsubps_avx(auVar28,auVar32);
  auVar33._0_4_ = auVar19._0_4_ * auVar19._0_4_;
  auVar33._4_4_ = auVar19._4_4_ * auVar19._4_4_;
  auVar33._8_4_ = auVar19._8_4_ * auVar19._8_4_;
  auVar33._12_4_ = auVar19._12_4_ * auVar19._12_4_;
  auVar27 = vmovshdup_avx(auVar33);
  auVar27 = vfmadd231ss_fma(auVar27,auVar19,auVar19);
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
  local_f8 = vsqrtss_avx(auVar27,auVar27);
  fVar18 = local_f8._0_4_;
  auVar34._4_4_ = fVar18;
  auVar34._0_4_ = fVar18;
  auVar34._8_4_ = fVar18;
  auVar34._12_4_ = fVar18;
  auVar27 = vdivps_avx(auVar19,auVar34);
  fVar21 = fVar21 / fVar18;
  fVar18 = (this->super_ProjectiveCamera).lensRadius;
  local_110.x = 0.0;
  local_110.y = 0.0;
  auVar29._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
  auVar29._8_4_ = auVar27._8_4_ ^ 0x80000000;
  auVar29._12_4_ = auVar27._12_4_ ^ 0x80000000;
  auVar31 = ZEXT856(auVar29._8_8_);
  auVar23._0_4_ = -fVar21;
  auVar23._4_4_ = 0x80000000;
  auVar23._8_4_ = 0x80000000;
  auVar23._12_4_ = 0x80000000;
  auVar26 = ZEXT856(auVar23._8_8_);
  local_e8._0_8_ = vmovlps_avx(auVar29);
  local_e8.z = auVar23._0_4_;
  TStack_b0.z = fVar17;
  Interaction::SpawnRay(&local_88,(Interaction *)local_d8,(Vector3f *)&local_e8);
  SVar37 = We(this,&local_88.super_Ray,lambda_00,(Point2f *)&local_110);
  auVar30._0_8_ = SVar37.values.values._8_8_;
  auVar30._8_56_ = auVar31;
  auVar25._0_8_ = SVar37.values.values._0_8_;
  auVar25._8_56_ = auVar26;
  auVar19 = vmovlhps_avx(auVar25._0_16_,auVar30._0_16_);
  if ((SVar37.values.values[0] == 0.0) && (!NAN(SVar37.values.values[0]))) {
    uVar16 = 0xffffffffffffffff;
    do {
      if (uVar16 == 2) goto LAB_00390b6a;
      lVar3 = uVar16 * 4;
      uVar16 = uVar16 + 1;
    } while ((*(float *)(local_f8 + lVar3 + -8) == 0.0) && (!NAN(*(float *)(local_f8 + lVar3 + -8)))
            );
    if (2 < uVar16) {
LAB_00390b6a:
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
      *(undefined8 *)&__return_storage_ptr__->set = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
      (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
      return __return_storage_ptr__;
    }
  }
  uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar18),ZEXT816(0) << 0x40,4);
  bVar7 = (bool)((byte)uVar4 & 1);
  auVar36 = vmovshdup_avx(auVar27);
  auVar6 = vmovshdup_avx(auVar20);
  auVar36 = vfmadd213ss_fma(auVar6,auVar36,ZEXT416((uint)(fVar17 * fVar21)));
  auVar6 = vfmsub213ss_fma(ZEXT416((uint)fVar17),ZEXT416((uint)fVar21),
                           ZEXT416((uint)(fVar17 * fVar21)));
  local_108 = auVar19._0_8_;
  uStack_100 = auVar19._8_8_;
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ + auVar6._0_4_)),auVar27,auVar20);
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar19 = vandps_avx512vl(auVar19,auVar8);
  (__return_storage_ptr__->optionalValue).__align = local_108;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = uStack_100;
  IVar9 = (ref->pi).super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
  IVar10 = (ref->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  uVar4 = *(undefined8 *)&ref->time;
  uVar11 = *(undefined8 *)&(ref->wo).super_Tuple3<pbrt::Vector3,_float>.y;
  uVar12 = *(undefined8 *)&(ref->n).super_Tuple3<pbrt::Normal3,_float>;
  uVar13 = *(undefined8 *)&(ref->n).super_Tuple3<pbrt::Normal3,_float>.z;
  uVar14 = *(undefined8 *)&(ref->uv).super_Tuple2<pbrt::Point2,_float>.y;
  *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
       (ref->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
  *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x30) = IVar9;
  *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x38) = IVar10;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = uVar4;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = uVar11;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = uVar12;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = uVar13;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = uVar14;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x68) = ref->mediumInterface;
  uVar5 = (ref->medium).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0xb8) = local_98;
  pIVar2 = (Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x78);
  pIVar2->low = (float)local_d8._0_4_;
  pIVar2->high = (float)local_d8._4_4_;
  pIVar2 = (Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x80);
  pIVar2->low = (float)local_d8._8_4_;
  pIVar2->high = (float)local_d8._12_4_;
  *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x88) = IStack_c8;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x90) = CONCAT44(fStack_bc,FStack_c0);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x98) = CONCAT44(fStack_b4,fStack_b8);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = TStack_b0._0_8_;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = CONCAT44(fStack_a4,TStack_b0.z);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = CONCAT44(uStack_9c,fStack_a0);
  __return_storage_ptr__->set = true;
  uVar4 = vmovlps_avx(auVar27);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar4;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar21;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) =
       ((float)local_f8._0_4_ * (float)local_f8._0_4_) /
       ((float)((uint)bVar7 * (int)(fVar18 * fVar18 * 3.1415927) + (uint)!bVar7 * 0x3f800000) *
       auVar19._0_4_);
  *(Tuple2<pbrt::Point2,_float> *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_110;
  *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x70) = uVar5;
  *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = local_90.bits;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraWiSample> PerspectiveCamera::SampleWi(
    const Interaction &ref, const Point2f &u, SampledWavelengths &lambda) const {
    // Uniformly sample a lens interaction _lensIntr_
    Point2f pLens = lensRadius * SampleUniformDiskConcentric(u);
    Point3f pLensRender = RenderFromCamera(Point3f(pLens.x, pLens.y, 0), ref.time);
    Normal3f n = Normal3f(RenderFromCamera(Vector3f(0, 0, 1), ref.time));
    Interaction lensIntr(pLensRender, n, ref.time, medium);

    // Populate arguments and compute the importance value
    // Compute incident direction to camera _wi_ at _ref_
    Vector3f wi = lensIntr.p() - ref.p();
    Float dist = Length(wi);
    wi /= dist;

    // Compute PDF for importance arriving at _ref_
    Float lensArea = lensRadius != 0 ? (Pi * lensRadius * lensRadius) : 1;
    Float pdf = (dist * dist) / (AbsDot(lensIntr.n, wi) * lensArea);

    Point2f pRaster;
    SampledSpectrum Wi = We(lensIntr.SpawnRay(-wi), lambda, &pRaster);
    if (!Wi)
        return {};
    return CameraWiSample(Wi, wi, pdf, pRaster, ref, lensIntr);
}